

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_peek_bitset.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::hash_peek_bitset<char>::test_icase_
          (hash_peek_bitset<char> *this,bool icase)

{
  bool bVar1;
  size_t sVar2;
  
  sVar2 = std::_Base_bitset<4UL>::_M_do_count(&(this->bset_).super__Base_bitset<4UL>);
  if (sVar2 == 0) {
LAB_001235f9:
    this->icase_ = icase;
    bVar1 = true;
  }
  else {
    if (sVar2 != 0x100) {
      if (this->icase_ == icase) goto LAB_001235f9;
      set_all(this);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool test_icase_(bool icase)
    {
        std::size_t count = this->bset_.count();

        if(256 == count)
        {
            return false; // all set already, nothing to do
        }
        else if(0 != count && this->icase_ != icase)
        {
            this->set_all(); // icase mismatch! set all and bail
            return false;
        }

        this->icase_ = icase;
        return true;
    }